

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O2

Tag * __thiscall wasm::Module::addTag(Module *this,Tag *curr)

{
  Tag *pTVar1;
  string local_48;
  allocator<char> local_21;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"addTag",&local_21);
  pTVar1 = addModuleElement<std::vector<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>,std::allocator<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>>>,std::unordered_map<wasm::Name,wasm::Tag*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Tag*>>>,wasm::Tag>
                     (&this->tags,&this->tagsMap,curr,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return pTVar1;
}

Assistant:

Tag* Module::addTag(Tag* curr) {
  return addModuleElement(tags, tagsMap, curr, "addTag");
}